

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::solveConstraints(btSoftBody *this)

{
  btScalar *pbVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Link *pLVar9;
  long lVar10;
  long lVar11;
  Anchor *pAVar12;
  btCollisionObject *this_00;
  Node *pNVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  long lVar17;
  code *pcVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  float fVar22;
  btVector3 ra;
  btVector3 local_70;
  btMatrix3x3 local_60;
  
  applyClusters(this,false);
  lVar17 = (long)(this->m_links).m_size;
  if (0 < lVar17) {
    lVar19 = 0;
    do {
      pLVar9 = (this->m_links).m_data;
      lVar10 = *(long *)((long)pLVar9->m_n + lVar19);
      lVar11 = *(long *)((long)pLVar9->m_n + lVar19 + 8);
      uVar6 = *(undefined8 *)(lVar11 + 0x20);
      uVar7 = *(undefined8 *)(lVar10 + 0x20);
      auVar15._4_4_ = (float)((ulong)uVar6 >> 0x20) - (float)((ulong)uVar7 >> 0x20);
      auVar15._0_4_ = (float)uVar6 - (float)uVar7;
      auVar15._8_4_ = *(float *)(lVar11 + 0x28) - *(float *)(lVar10 + 0x28);
      auVar15._12_4_ = 0;
      *(undefined1 (*) [16])((long)(pLVar9->m_c3).m_floats + lVar19) = auVar15;
      fVar22 = *(float *)((long)(pLVar9->m_c3).m_floats + lVar19);
      fVar4 = *(float *)((long)(pLVar9->m_c3).m_floats + lVar19 + 4);
      fVar5 = *(float *)((long)(pLVar9->m_c3).m_floats + lVar19 + 8);
      *(float *)((long)(pLVar9->m_c3).m_floats + lVar19 + -4) =
           1.0 / ((fVar5 * fVar5 + fVar22 * fVar22 + fVar4 * fVar4) *
                 *(float *)((long)(pLVar9->m_c3).m_floats + lVar19 + -0xc));
      lVar19 = lVar19 + 0x48;
    } while (lVar17 * 0x48 != lVar19);
  }
  lVar17 = (long)(this->m_anchors).m_size;
  if (0 < lVar17) {
    lVar19 = 0;
    do {
      pAVar12 = (this->m_anchors).m_data;
      this_00 = *(btCollisionObject **)((long)(pAVar12->m_c0).m_el[0].m_floats + lVar19 + -0xc);
      fVar22 = *(float *)((long)(pAVar12->m_local).m_floats + lVar19);
      fVar4 = *(float *)((long)(pAVar12->m_local).m_floats + lVar19 + 4);
      fVar5 = *(float *)((long)(pAVar12->m_local).m_floats + lVar19 + 8);
      local_70.m_floats[1] =
           fVar5 * (this_00->m_worldTransform).m_basis.m_el[1].m_floats[2] +
           fVar22 * (this_00->m_worldTransform).m_basis.m_el[1].m_floats[0] +
           (this_00->m_worldTransform).m_basis.m_el[1].m_floats[1] * fVar4;
      local_70.m_floats[0] =
           fVar5 * (this_00->m_worldTransform).m_basis.m_el[0].m_floats[2] +
           fVar22 * (this_00->m_worldTransform).m_basis.m_el[0].m_floats[0] +
           (this_00->m_worldTransform).m_basis.m_el[0].m_floats[1] * fVar4;
      local_70.m_floats[2] =
           fVar5 * (this_00->m_worldTransform).m_basis.m_el[2].m_floats[2] +
           fVar22 * (this_00->m_worldTransform).m_basis.m_el[2].m_floats[0] +
           fVar4 * (this_00->m_worldTransform).m_basis.m_el[2].m_floats[1];
      local_70.m_floats[3] = 0.0;
      lVar10 = *(long *)((long)(pAVar12->m_local).m_floats + lVar19 + -8);
      ImpulseMatrix(&local_60,(this->m_sst).sdt,*(btScalar *)(lVar10 + 0x60),
                    this_00[1].m_interpolationWorldTransform.m_basis.m_el[0].m_floats[1],
                    (btMatrix3x3 *)&this_00->field_0x14c,&local_70);
      pbVar1 = (btScalar *)((long)(pAVar12->m_c0).m_el[0].m_floats + lVar19);
      *(undefined8 *)pbVar1 = local_60.m_el[0].m_floats._0_8_;
      *(undefined8 *)(pbVar1 + 2) = local_60.m_el[0].m_floats._8_8_;
      pbVar1 = (btScalar *)((long)(pAVar12->m_c0).m_el[1].m_floats + lVar19);
      *(undefined8 *)pbVar1 = local_60.m_el[1].m_floats._0_8_;
      *(undefined8 *)(pbVar1 + 2) = local_60.m_el[1].m_floats._8_8_;
      pbVar1 = (btScalar *)((long)(pAVar12->m_c0).m_el[2].m_floats + lVar19);
      *(undefined8 *)pbVar1 = local_60.m_el[2].m_floats._0_8_;
      *(undefined8 *)(pbVar1 + 2) = local_60.m_el[2].m_floats._8_8_;
      pbVar1 = (btScalar *)((long)(pAVar12->m_c1).m_floats + lVar19);
      *(undefined8 *)pbVar1 = local_70.m_floats._0_8_;
      *(undefined8 *)(pbVar1 + 2) = local_70.m_floats._8_8_;
      *(float *)((long)(&pAVar12->m_c1 + 1) + lVar19) =
           (this->m_sst).sdt * *(float *)(lVar10 + 0x60);
      btCollisionObject::activate(this_00,false);
      lVar19 = lVar19 + 0x68;
    } while (lVar17 * 0x68 - lVar19 != 0);
  }
  if (0 < (this->m_cfg).viterations) {
    if (0 < (this->m_cfg).viterations) {
      iVar20 = 0;
      do {
        if (0 < (this->m_cfg).m_vsequence.m_size) {
          lVar17 = 0;
          do {
            pcVar18 = VSolve_Links;
            if ((this->m_cfg).m_vsequence.m_data[lVar17] != Linear) {
              pcVar18 = (code *)0x0;
            }
            (*pcVar18)(0x3f800000,this);
            lVar17 = lVar17 + 1;
          } while (lVar17 < (this->m_cfg).m_vsequence.m_size);
        }
        iVar20 = iVar20 + 1;
      } while (iVar20 < (this->m_cfg).viterations);
    }
    lVar17 = (long)(this->m_nodes).m_size;
    if (0 < lVar17) {
      lVar19 = 0;
      do {
        pNVar13 = (this->m_nodes).m_data;
        fVar22 = (this->m_sst).sdt;
        uVar6 = *(undefined8 *)((long)(pNVar13->m_q).m_floats + lVar19);
        uVar7 = *(undefined8 *)((long)(pNVar13->m_v).m_floats + lVar19);
        auVar14._4_4_ = fVar22 * (float)((ulong)uVar7 >> 0x20) + (float)((ulong)uVar6 >> 0x20);
        auVar14._0_4_ = fVar22 * (float)uVar7 + (float)uVar6;
        auVar14._8_4_ =
             *(float *)((long)(pNVar13->m_v).m_floats + lVar19 + 8) * fVar22 +
             *(float *)((long)(pNVar13->m_q).m_floats + lVar19 + 8);
        auVar14._12_4_ = 0;
        *(undefined1 (*) [16])((long)(pNVar13->m_x).m_floats + lVar19) = auVar14;
        lVar19 = lVar19 + 0x78;
      } while (lVar17 * 0x78 - lVar19 != 0);
    }
  }
  if (0 < (this->m_cfg).piterations) {
    iVar20 = (this->m_cfg).piterations;
    if (0 < iVar20) {
      iVar21 = 0;
      do {
        if (0 < (this->m_cfg).m_psequence.m_size) {
          lVar17 = 0;
          do {
            (*(code *)(&PTR_PSolve_Links_00229448)[(int)(this->m_cfg).m_psequence.m_data[lVar17]])
                      (0x3f800000,(float)iVar21 / (float)iVar20,this);
            lVar17 = lVar17 + 1;
          } while (lVar17 < (this->m_cfg).m_psequence.m_size);
        }
        iVar21 = iVar21 + 1;
        iVar20 = (this->m_cfg).piterations;
      } while (iVar21 < iVar20);
    }
    lVar17 = (long)(this->m_nodes).m_size;
    if (0 < lVar17) {
      fVar22 = (1.0 - (this->m_cfg).kDP) * (this->m_sst).isdt;
      lVar19 = 0;
      do {
        pNVar13 = (this->m_nodes).m_data;
        uVar6 = *(undefined8 *)((long)(pNVar13->m_x).m_floats + lVar19);
        uVar7 = *(undefined8 *)((long)(pNVar13->m_q).m_floats + lVar19);
        auVar16._4_4_ = ((float)((ulong)uVar6 >> 0x20) - (float)((ulong)uVar7 >> 0x20)) * fVar22;
        auVar16._0_4_ = ((float)uVar6 - (float)uVar7) * fVar22;
        auVar16._8_4_ =
             (*(float *)((long)(pNVar13->m_x).m_floats + lVar19 + 8) -
             *(float *)((long)(pNVar13->m_q).m_floats + lVar19 + 8)) * fVar22;
        auVar16._12_4_ = 0;
        *(undefined1 (*) [16])((long)(pNVar13->m_v).m_floats + lVar19) = auVar16;
        puVar2 = (undefined8 *)((long)(pNVar13->m_f).m_floats + lVar19);
        *puVar2 = 0;
        puVar2[1] = 0;
        lVar19 = lVar19 + 0x78;
      } while (lVar17 * 0x78 - lVar19 != 0);
    }
  }
  if (0 < (this->m_cfg).diterations) {
    fVar22 = (this->m_cfg).kVCF * (this->m_sst).isdt;
    lVar17 = (long)(this->m_nodes).m_size;
    if (0 < lVar17) {
      lVar19 = 0;
      do {
        pNVar13 = (this->m_nodes).m_data;
        puVar2 = (undefined8 *)((long)(pNVar13->m_x).m_floats + lVar19);
        uVar6 = puVar2[1];
        puVar3 = (undefined8 *)((long)(pNVar13->m_q).m_floats + lVar19);
        *puVar3 = *puVar2;
        puVar3[1] = uVar6;
        lVar19 = lVar19 + 0x78;
      } while (lVar17 * 0x78 - lVar19 != 0);
    }
    if (0 < (this->m_cfg).diterations) {
      iVar20 = 0;
      do {
        if (0 < (this->m_cfg).m_dsequence.m_size) {
          lVar17 = 0;
          do {
            (*(code *)(&PTR_PSolve_Links_00229448)[(int)(this->m_cfg).m_dsequence.m_data[lVar17]])
                      (0x3f800000,0,this);
            lVar17 = lVar17 + 1;
          } while (lVar17 < (this->m_cfg).m_dsequence.m_size);
        }
        iVar20 = iVar20 + 1;
      } while (iVar20 < (this->m_cfg).diterations);
    }
    lVar17 = (long)(this->m_nodes).m_size;
    if (0 < lVar17) {
      pNVar13 = (this->m_nodes).m_data;
      lVar19 = 0;
      do {
        fVar4 = *(float *)((long)(pNVar13->m_x).m_floats + lVar19 + 8);
        fVar5 = *(float *)((long)(pNVar13->m_q).m_floats + lVar19 + 8);
        uVar6 = *(undefined8 *)((long)(pNVar13->m_x).m_floats + lVar19);
        uVar7 = *(undefined8 *)((long)(pNVar13->m_q).m_floats + lVar19);
        uVar8 = *(undefined8 *)((long)(pNVar13->m_v).m_floats + lVar19);
        *(ulong *)((long)(pNVar13->m_v).m_floats + lVar19) =
             CONCAT44((float)((ulong)uVar8 >> 0x20) +
                      ((float)((ulong)uVar6 >> 0x20) - (float)((ulong)uVar7 >> 0x20)) * fVar22,
                      (float)uVar8 + ((float)uVar6 - (float)uVar7) * fVar22);
        *(float *)((long)(pNVar13->m_v).m_floats + lVar19 + 8) =
             (fVar4 - fVar5) * fVar22 + *(float *)((long)(pNVar13->m_v).m_floats + lVar19 + 8);
        lVar19 = lVar19 + 0x78;
      } while (lVar17 * 0x78 - lVar19 != 0);
    }
  }
  dampClusters(this);
  applyClusters(this,true);
  return;
}

Assistant:

void			btSoftBody::solveConstraints()
{

	/* Apply clusters		*/ 
	applyClusters(false);
	/* Prepare links		*/ 

	int i,ni;

	for(i=0,ni=m_links.size();i<ni;++i)
	{
		Link&	l=m_links[i];
		l.m_c3		=	l.m_n[1]->m_q-l.m_n[0]->m_q;
		l.m_c2		=	1/(l.m_c3.length2()*l.m_c0);
	}
	/* Prepare anchors		*/ 
	for(i=0,ni=m_anchors.size();i<ni;++i)
	{
		Anchor&			a=m_anchors[i];
		const btVector3	ra=a.m_body->getWorldTransform().getBasis()*a.m_local;
		a.m_c0	=	ImpulseMatrix(	m_sst.sdt,
			a.m_node->m_im,
			a.m_body->getInvMass(),
			a.m_body->getInvInertiaTensorWorld(),
			ra);
		a.m_c1	=	ra;
		a.m_c2	=	m_sst.sdt*a.m_node->m_im;
		a.m_body->activate();
	}
	/* Solve velocities		*/ 
	if(m_cfg.viterations>0)
	{
		/* Solve			*/ 
		for(int isolve=0;isolve<m_cfg.viterations;++isolve)
		{
			for(int iseq=0;iseq<m_cfg.m_vsequence.size();++iseq)
			{
				getSolver(m_cfg.m_vsequence[iseq])(this,1);
			}
		}
		/* Update			*/ 
		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			Node&	n=m_nodes[i];
			n.m_x	=	n.m_q+n.m_v*m_sst.sdt;
		}
	}
	/* Solve positions		*/ 
	if(m_cfg.piterations>0)
	{
		for(int isolve=0;isolve<m_cfg.piterations;++isolve)
		{
			const btScalar ti=isolve/(btScalar)m_cfg.piterations;
			for(int iseq=0;iseq<m_cfg.m_psequence.size();++iseq)
			{
				getSolver(m_cfg.m_psequence[iseq])(this,1,ti);
			}
		}
		const btScalar	vc=m_sst.isdt*(1-m_cfg.kDP);
		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			Node&	n=m_nodes[i];
			n.m_v	=	(n.m_x-n.m_q)*vc;
			n.m_f	=	btVector3(0,0,0);		
		}
	}
	/* Solve drift			*/ 
	if(m_cfg.diterations>0)
	{
		const btScalar	vcf=m_cfg.kVCF*m_sst.isdt;
		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			Node&	n=m_nodes[i];
			n.m_q	=	n.m_x;
		}
		for(int idrift=0;idrift<m_cfg.diterations;++idrift)
		{
			for(int iseq=0;iseq<m_cfg.m_dsequence.size();++iseq)
			{
				getSolver(m_cfg.m_dsequence[iseq])(this,1,0);
			}
		}
		for(int i=0,ni=m_nodes.size();i<ni;++i)
		{
			Node&	n=m_nodes[i];
			n.m_v	+=	(n.m_x-n.m_q)*vcf;
		}
	}
	/* Apply clusters		*/ 
	dampClusters();
	applyClusters(true);
}